

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall cfdcapi_psbt_FinalizePsbt_Test::TestBody(cfdcapi_psbt_FinalizePsbt_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  uint32_t in_stack_00000088;
  uint32_t in_stack_0000008c;
  char *in_stack_00000090;
  char *in_stack_00000098;
  int in_stack_000000a4;
  void *in_stack_000000a8;
  void **in_stack_000000c0;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *output;
  char *exp_psbt_base64;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffb98;
  AssertionResult *in_stack_fffffffffffffba0;
  CfdErrorCode *in_stack_fffffffffffffba8;
  char *in_stack_fffffffffffffbb0;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  char *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  char *in_stack_fffffffffffffc68;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffcd8;
  char *in_stack_fffffffffffffce0;
  AssertHelper local_2e0;
  Message local_2d8;
  undefined4 local_2cc;
  uint32_t in_stack_fffffffffffffd44;
  AssertHelper in_stack_fffffffffffffd48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  AssertionResult local_2a0;
  uint32_t in_stack_fffffffffffffd74;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  void *in_stack_fffffffffffffd88;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_254;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  undefined4 local_204;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  AssertHelper local_180;
  Message local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  AssertHelper local_158;
  Message local_150;
  undefined4 local_144;
  AssertionResult local_140;
  AssertHelper local_130;
  Message local_128;
  undefined4 local_11c;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  undefined4 local_f4;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x38547a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x161,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3854dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x385532);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,(type *)0x385566);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x162,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x385662);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3856dd);
  local_9c = 1;
  local_a8 = 0;
  local_b0 = 
  "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHAQcXFgAUlixOCPM206+8NBXJ01muEEBHBSABCGsCRzBEAiApmGKmeptFTWzaX+40pS2Qib+gJERNiAMcNKmOKYvbygIgS0f89Qe4CVQQjgN1Zz/b3QhMX7uZT2yVFyDy6y9ruGYBIQJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/gABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAAAEHakcwRAIgZuyVbpZ4PNYSLJwHcyo66ZMbaava/x82LCjtX6lnKNMCIGoW1K5G/tSNPQSSc3YTvZtR/j4kU7REbkR8Zb8sln4QASEC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
  ;
  local_b8 = (char *)0x0;
  local_14 = CfdCreatePsbtHandle(in_stack_000000a8,in_stack_000000a4,in_stack_00000098,
                                 in_stack_00000090,in_stack_0000008c,in_stack_00000088,
                                 in_stack_000000c0);
  local_cc = 0;
  pAVar4 = &local_c8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
             in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    in_stack_fffffffffffffce0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3857f9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x16a,in_stack_fffffffffffffce0);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x38585c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3858b4);
  if (local_14 == 0) {
    local_14 = CfdIsFinalizedPsbt(in_stack_fffffffffffffc68,
                                  (void *)CONCAT17(in_stack_fffffffffffffc67,
                                                   in_stack_fffffffffffffc60));
    local_f4 = 7;
    this_00 = &local_f0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    uVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x38598b);
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x16d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_108,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      testing::Message::~Message((Message *)0x3859ee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x385a46);
    local_14 = CfdIsFinalizedPsbtInput
                         ((void *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          in_stack_fffffffffffffd50.ptr_,(char *)in_stack_fffffffffffffd48.data_,
                          in_stack_fffffffffffffd44);
    local_11c = 7;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x385b1b);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x170,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      testing::Message::~Message((Message *)0x385b7e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x385bd6);
    local_14 = CfdIsFinalizedPsbtInput
                         ((void *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          in_stack_fffffffffffffd50.ptr_,(char *)in_stack_fffffffffffffd48.data_,
                          in_stack_fffffffffffffd44);
    local_144 = 7;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    if (!bVar1) {
      testing::Message::Message(&local_150);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x385ca8);
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x173,pcVar3);
      testing::internal::AssertHelper::operator=(&local_158,&local_150);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      testing::Message::~Message((Message *)0x385d0b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x385d63);
    local_14 = CfdVerifyPsbtTxIn(in_stack_fffffffffffffd88,
                                 (void *)CONCAT44(in_stack_fffffffffffffd84,
                                                  in_stack_fffffffffffffd80),
                                 (char *)in_stack_fffffffffffffd78.ptr_,in_stack_fffffffffffffd74);
    local_16c = 7;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x385e38);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x176,pcVar3);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      testing::Message::~Message((Message *)0x385e9b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x385ef3);
    local_14 = CfdFinalizePsbt(in_stack_fffffffffffffc68,
                               (void *)CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60)
                              );
    local_194 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      in_stack_fffffffffffffc68 =
           testing::AssertionResult::failure_message((AssertionResult *)0x385fbc);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x179,in_stack_fffffffffffffc68);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::Message::~Message((Message *)0x38601f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x386077);
    local_14 = CfdGetPsbtData(pAVar4,in_stack_fffffffffffffce0,
                              (char **)CONCAT17(uVar2,in_stack_fffffffffffffcd8),(char **)this_00);
    local_1bc = 0;
    pAVar4 = &local_1b8;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_1c8);
      in_stack_fffffffffffffc50 =
           testing::AssertionResult::failure_message((AssertionResult *)0x38614c);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x17c,in_stack_fffffffffffffc50);
      testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      testing::Message::~Message((Message *)0x3861af);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x386204);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1e0,"exp_psbt_base64","output",local_b0,local_b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
      if (!bVar1) {
        testing::Message::Message(&local_1e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3862b4);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0x17e,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        testing::Message::~Message((Message *)0x386317);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x38636c);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffba8);
      local_b8 = (char *)0x0;
    }
    local_14 = CfdIsFinalizedPsbt(in_stack_fffffffffffffc68,
                                  (void *)CONCAT17(uVar2,in_stack_fffffffffffffc60));
    local_204 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
    if (!bVar1) {
      testing::Message::Message(&local_210);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x386450);
      testing::internal::AssertHelper::AssertHelper
                (&local_218,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x184,pcVar3);
      testing::internal::AssertHelper::operator=(&local_218,&local_210);
      testing::internal::AssertHelper::~AssertHelper(&local_218);
      testing::Message::~Message((Message *)0x3864b3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38650b);
    local_14 = CfdIsFinalizedPsbtInput
                         ((void *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          in_stack_fffffffffffffd50.ptr_,(char *)in_stack_fffffffffffffd48.data_,
                          in_stack_fffffffffffffd44);
    local_22c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3865da);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x187,pcVar3);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x386637);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38668f);
    local_14 = CfdIsFinalizedPsbtInput
                         ((void *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                          in_stack_fffffffffffffd50.ptr_,(char *)in_stack_fffffffffffffd48.data_,
                          in_stack_fffffffffffffd44);
    local_254 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_250);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x386755);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x18a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x3867b2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38680a);
    local_14 = CfdVerifyPsbtTxIn(in_stack_fffffffffffffd88,
                                 (void *)CONCAT44(in_stack_fffffffffffffd84,
                                                  in_stack_fffffffffffffd80),
                                 (char *)in_stack_fffffffffffffd78.ptr_,in_stack_fffffffffffffd74);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd88);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd78);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3868d3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0x18d,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd70,(Message *)&stack0xfffffffffffffd78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd70);
      testing::Message::~Message((Message *)0x386930);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x386988);
    local_14 = CfdFreePsbtHandle(pAVar4,in_stack_fffffffffffffc50);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd50);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x386a45);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,400,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd48,(Message *)&stack0xfffffffffffffd50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd48);
      testing::Message::~Message((Message *)0x386aa2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x386af7);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffba8);
  local_2cc = 0;
  pAVar4 = (AssertionResult *)&stack0xfffffffffffffd38;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),(char *)pAVar4,
             in_stack_fffffffffffffba8,(int *)in_stack_fffffffffffffba0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x386bae);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0x194,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message((Message *)0x386c0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x386c60);
  return;
}

Assistant:

TEST(cfdcapi_psbt, FinalizePsbt) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_base64 = "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHAQcXFgAUlixOCPM206+8NBXJ01muEEBHBSABCGsCRzBEAiApmGKmeptFTWzaX+40pS2Qib+gJERNiAMcNKmOKYvbygIgS0f89Qe4CVQQjgN1Zz/b3QhMX7uZT2yVFyDy6y9ruGYBIQJWUkhGCzwYbezxPbBvByT9ULR8w+SJwwB2yDY9UDjO/gABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAAAEHakcwRAIgZuyVbpZ4PNYSLJwHcyo66ZMbaava/x82LCjtX6lnKNMCIGoW1K5G/tSNPQSSc3YTvZtR/j4kU7REbkR8Zb8sln4QASEC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAEA9gIAAAAAAQHxmT/o5xiVQu5FBiWOFwIBviknA80nWssJ7OFmcv2EiwAAAAAXFgAUrJ74CyevHJ2VwdtddhMZMivEL8X/////AggEECQBAAAAFgAUCd4qBDHLs0RPwiytnZoP0JY5chAA4fUFAAAAABepFFCfWYX06QoU+5Djkxb9tPOsl1MHhwJHMEQCIB4H33IcMyJBno820H7q5HlZdboNnRljDKPNPcDUlnFyAiAVQo574GtlZ1AVOQUL15GjgPALvdvFCX6pe6e+QBcRSgEhAkrvQ7HVrHulAUmY1jzqxYOVnR/cZuommc2E7q+CooMGAAAAAAEBIADh9QUAAAAAF6kUUJ9ZhfTpChT7kOOTFv2086yXUweHIgICVlJIRgs8GG3s8T2wbwck/VC0fMPkicMAdsg2PVA4zv5HMEQCICmYYqZ6m0VNbNpf7jSlLZCJv6AkRE2IAxw0qY4pi9vKAiBLR/z1B7gJVBCOA3VnP9vdCExfu5lPbJUXIPLrL2u4ZgEBAwQBAAAAAQQWABSWLE4I8zbTr7w0FcnTWa4QQEcFICIGAlZSSEYLPBht7PE9sG8HJP1QtHzD5InDAHbINj1QOM7+GCpwR2AsAACAAAAAgAAAAIABAAAAAQAAAAABAL8CAAAAAcbS6jbi6AK1LdrGZdrL7S+DG1JjRZ4cpzT1yUXXUV5AAAAAAGpHMEQCIBG5bH0tDS6NyzcTjhisxGB1KWWt2cuHh99cNJ3w4q5mAiAuk68xtk9RZuVgWBlVXavsV755QwD62zcFLzHd3qmQXAEhA+PSRKOWfguHdl/ahsX/OIhfdJk5U7lYQ4iu8wsmr2rs/////wF4Uc0dAAAAABl2qRSNIEQ6kZaeO8oOJAzQ/+TcmMY94oisAAAAACICAtn2iI8oWhWmoYgKIgLCsjCkLXfPYtpqSKykGYJizaPHRzBEAiBm7JVulng81hIsnAdzKjrpkxtpq9r/HzYsKO1fqWco0wIgahbUrkb+1I09BJJzdhO9m1H+PiRTtERuRHxlvyyWfhABIgYC2faIjyhaFaahiAoiAsKyMKQtd89i2mpIrKQZgmLNo8cYnWtthiwAAIAAAACAAAAAgAAAAAABAAAAACICA0c7/Ix3DBsiCi56rkut9sDX6vKQKNWynTQ4ASuyie+BGCpwR2AsAACAAAAAgAAAAIAAAAAAAgAAAAAiAgNkdK/yYzw1GGVTn7UrYrnW+55OI1dmKOHwoKeZNFjgbBida22GLAAAgAAAAIAAAACAAAAAAAIAAAAA", "", 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdIsFinalizedPsbt(handle, psbt_handle);
    EXPECT_EQ(kCfdSignVerificationError, ret);

    ret = CfdIsFinalizedPsbtInput(handle, psbt_handle, "c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26", 1);
    EXPECT_EQ(kCfdSignVerificationError, ret);

    ret = CfdIsFinalizedPsbtInput(handle, psbt_handle, "c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d", 0);
    EXPECT_EQ(kCfdSignVerificationError, ret);

    ret = CfdVerifyPsbtTxIn(handle, psbt_handle, "c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26", 1);
    EXPECT_EQ(kCfdSignVerificationError, ret);

    ret = CfdFinalizePsbt(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdIsFinalizedPsbt(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdIsFinalizedPsbtInput(handle, psbt_handle, "c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26", 1);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdIsFinalizedPsbtInput(handle, psbt_handle, "c0ecc9313d16355d71b96acff5bca43cdb593289e50154bab12cff422a46257d", 0);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdVerifyPsbtTxIn(handle, psbt_handle, "c078957064d70a5e80c3c23302528524d424aaabce86fb3fc1b6e6ea76fd7f26", 1);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}